

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SetText
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr pszSrc,size_t offset,
          size_t length,charcount_t charOffset,bool isUtf8,ULONG grfscr,ULONG lineNumber)

{
  DecodeOptions DVar1;
  OLECHAR OVar2;
  EncodedCharPtr p;
  
  this->m_pchBase = pszSrc;
  p = pszSrc + offset;
  this->m_pchLast = p + length;
  this->m_pchMinTok = p;
  this->m_pchMinLine = p;
  this->m_currentCharacter = p;
  this->m_pchPrevLine = p;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = offset - charOffset;
  if (offset == 0) {
    OVar2 = UTF8EncodingPolicyBase<false>::PeekFull
                      (&this->super_UTF8EncodingPolicyBase<false>,p,p + length);
    if ((OVar2 == L'￮') || (OVar2 == L'\xfeff')) {
      UTF8EncodingPolicyBase<false>::ReadFull<true>
                (&this->super_UTF8EncodingPolicyBase<false>,&this->m_currentCharacter,
                 this->m_pchLast);
    }
  }
  this->m_line = lineNumber;
  this->m_startLine = lineNumber;
  this->m_pchStartLine = this->m_currentCharacter;
  this->m_ptoken->tk = tkNone;
  this->m_fHadEol = 0;
  this->field_0x508 = this->field_0x508 & 0x3e | (byte)(grfscr >> 0xd) & 1;
  DVar1 = doAllowThreeByteSurrogates;
  if (isUtf8) {
    DVar1 = doAllowInvalidWCHARs;
  }
  (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions =
       DVar1 | (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions &
               ~(doAllowInvalidWCHARs|doAllowThreeByteSurrogates);
  return;
}

Assistant:

void Scanner<EncodingPolicy>::SetText(EncodedCharPtr pszSrc, size_t offset, size_t length, charcount_t charOffset, bool isUtf8, ULONG grfscr, ULONG lineNumber)
{
    // Save the start of the script and add the offset to get the point where we should start scanning.
    m_pchBase = pszSrc;
    m_pchLast = m_pchBase + offset + length;
    m_pchPrevLine = m_currentCharacter = m_pchMinLine = m_pchMinTok = pszSrc + offset;

    this->RestoreMultiUnits(offset - charOffset);

    // Absorb any byte order mark at the start
    if(offset == 0)
    {
        switch( this->PeekFull(m_currentCharacter, m_pchLast) )
        {
        case 0xFFEE:    // "Opposite" endian BOM
            // We do not support big-endian encodings
            // fall-through

        case 0xFEFF:    // "Correct" BOM
            this->template ReadFull<true>(m_currentCharacter, m_pchLast);
            break;
        }
    }

    m_line = lineNumber;
    m_startLine = lineNumber;
    m_pchStartLine = m_currentCharacter;
    m_ptoken->tk = tkNone;
    m_fIsModuleCode = (grfscr & fscrIsModuleCode) != 0;
    m_fHadEol = FALSE;
    m_DeferredParseFlags = ScanFlagNone;

    this->SetIsUtf8(isUtf8);
}